

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

void mess_init(void)

{
  long lVar1;
  t_symbol *ptVar2;
  _pdinstance *pdinstance;
  _pdinstance *pdinstance_00;
  _pdinstance *pdinstance_01;
  _pdinstance *pdinstance_02;
  _pdinstance *pdinstance_03;
  _pdinstance *pdinstance_04;
  _pdinstance *pdinstance_05;
  _pdinstance *pdinstance_06;
  _pdinstance *pdinstance_07;
  _pdinstance *pdinstance_08;
  _pdinstance *pdinstance_09;
  _pdinstance *pdinstance_10;
  
  if (pd_objectmaker != (t_pd)0x0) {
    return;
  }
  s_inter_newpdinstance();
  sys_lock();
  pd_globallock();
  pd_maininstance.pd_canvaslist = (_glist *)0x0;
  pd_maininstance.pd_templatelist = (_template *)0x0;
  pd_maininstance.pd_systime = 0.0;
  pd_maininstance.pd_clock_setlist = (_clock *)0x0;
  pd_maininstance.pd_symhash = (t_symbol **)getbytes(0x20000);
  for (lVar1 = 0; lVar1 != 0x4000; lVar1 = lVar1 + 1) {
    pd_maininstance.pd_symhash[lVar1] = (t_symbol *)0x0;
  }
  dogensym("pointer",&s_pointer,pdinstance);
  dogensym("float",&s_float,pdinstance_00);
  dogensym("symbol",&s_symbol,pdinstance_01);
  dogensym("bang",&s_bang,pdinstance_02);
  dogensym("list",&s_list,pdinstance_03);
  dogensym("anything",&s_anything,pdinstance_04);
  dogensym("signal",&s_signal,pdinstance_05);
  dogensym("#N",&s__N,pdinstance_06);
  dogensym("#X",&s__X,pdinstance_07);
  dogensym("x",&s_x,pdinstance_08);
  dogensym("y",&s_y,pdinstance_09);
  dogensym("",&s_,pdinstance_10);
  x_midi_newpdinstance();
  g_canvas_newpdinstance();
  d_ugen_newpdinstance();
  s_stuff_newpdinstance();
  class_extern_dir = &s_;
  ptVar2 = gensym("objectmaker");
  pd_objectmaker = class_new(ptVar2,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
  ptVar2 = gensym("canvasmaker");
  pd_canvasmaker = class_new(ptVar2,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
  if (pd_objectmaker != (t_pd)0x0) {
    pd_objectmaker->c_anymethod = new_anything;
  }
  pd_globalunlock();
  sys_unlock();
  return;
}

Assistant:

void mess_init(void)
{
    if (pd_objectmaker)
        return;
#ifdef PDINSTANCE
    pd_this = &pd_maininstance;
#endif
    s_inter_newpdinstance();
    sys_lock();
    pd_globallock();
    pdinstance_init(&pd_maininstance);
    class_extern_dir = &s_;
    pd_objectmaker = class_new(gensym("objectmaker"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    pd_canvasmaker = class_new(gensym("canvasmaker"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    class_addanything(pd_objectmaker, (t_method)new_anything);
    pd_globalunlock();
    sys_unlock();
}